

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

uint upsampled_setup_center_error
               (MACROBLOCKD *xd,AV1_COMMON *cm,MV *bestmv,SUBPEL_SEARCH_VAR_PARAMS *var_params,
               MV_COST_PARAMS *mv_cost_params,uint *sse1,int *distortion)

{
  int iVar1;
  int iVar2;
  
  iVar1 = upsampled_pref_error(xd,cm,bestmv,var_params,sse1);
  *distortion = iVar1;
  iVar2 = mv_err_cost_(bestmv,mv_cost_params);
  return iVar2 + iVar1;
}

Assistant:

static unsigned int upsampled_setup_center_error(
    MACROBLOCKD *xd, const AV1_COMMON *const cm, const MV *bestmv,
    const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *sse1, int *distortion) {
  unsigned int besterr = upsampled_pref_error(xd, cm, bestmv, var_params, sse1);
  *distortion = besterr;
  besterr += mv_err_cost_(bestmv, mv_cost_params);
  return besterr;
}